

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

float trng::math::detail::GammaQ<float,false>(float a,float x)

{
  float in_XMM0_Da;
  float fVar1;
  float in_XMM1_Da;
  float in_stack_00000020;
  float in_stack_00000024;
  undefined4 local_4;
  
  if ((in_XMM1_Da < 0.0) || (in_XMM0_Da <= 0.0)) {
    local_4 = std::numeric_limits<float>::signaling_NaN();
  }
  else if (in_XMM0_Da + 1.0 <= in_XMM1_Da) {
    local_4 = GammaQ_cf<float,false>(in_stack_00000024,in_stack_00000020);
  }
  else {
    local_4 = Gamma(0.0);
    fVar1 = GammaP_ser<float,false>(a,x);
    local_4 = local_4 - fVar1;
  }
  return local_4;
}

Assistant:

TRNG_CUDA_ENABLE T GammaQ(T a, T x) {
        if (x < 0 or a <= 0)
          return numeric_limits<T>::signaling_NaN();
#if __cplusplus >= 201703L
        if constexpr (by_Gamma_a) {
#else
        if (by_Gamma_a) {
#endif
          if (a > numeric_limits<T>::digits10 and x > T(3) / T(10) * a and
              x < T(235) / T(100) * a)
            return GammaQ_asympt(a, x);
          if (x < a + 1)
            return T{1} - GammaP_ser<T, true>(a, x);
          return GammaQ_cf<T, true>(a, x);
        } else {
          if (x < a + 1)
            return Gamma(a) - GammaP_ser<T, false>(a, x);
          return GammaQ_cf<T, false>(a, x);
        }
      }

    }